

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusargument.h
# Opt level: O1

QDBusObjectPath * qdbus_cast<QDBusObjectPath>(QDBusObjectPath *__return_storage_ptr__,QVariant *v)

{
  PrivateShared *pPVar1;
  bool bVar2;
  QMetaType QVar3;
  QDBusObjectPath *item;
  long in_FS_OFFSET;
  QDBusArgument local_30;
  QMetaType local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.d_ptr = (QMetaTypeInterface *)QVariant::metaType();
  local_30.d = (QDBusArgumentPrivate *)
               &QtPrivate::QMetaTypeInterfaceWrapper<QDBusArgument>::metaType;
  bVar2 = comparesEqual(&local_28,(QMetaType *)&local_30);
  if (bVar2) {
    local_28.d_ptr = &QtPrivate::QMetaTypeInterfaceWrapper<QDBusArgument>::metaType;
    local_30.d = (QDBusArgumentPrivate *)(*(ulong *)&(v->d).field_0x18 & 0xfffffffffffffffc);
    bVar2 = comparesEqual((QMetaType *)&local_30,&local_28);
    if (bVar2) {
      if (((v->d).field_0x18 & 1) != 0) {
        pPVar1 = (v->d).data.shared;
        v = (QVariant *)(pPVar1 + *(int *)(pPVar1 + 4));
      }
      QDBusArgument::QDBusArgument(&local_30,(QDBusArgument *)v);
    }
    else {
      local_30.d = (QDBusArgumentPrivate *)&DAT_aaaaaaaaaaaaaaaa;
      QDBusArgument::QDBusArgument(&local_30);
      QVar3.d_ptr = (QMetaTypeInterface *)QVariant::metaType();
      if (((v->d).field_0x18 & 1) != 0) {
        pPVar1 = (v->d).data.shared;
        v = (QVariant *)(pPVar1 + *(int *)(pPVar1 + 4));
      }
      QMetaType::convert(QVar3,v,local_28,&local_30);
    }
    (__return_storage_ptr__->m_path).d.d = (Data *)0x0;
    (__return_storage_ptr__->m_path).d.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->m_path).d.size = 0;
    QDBusArgument::operator>>(&local_30,__return_storage_ptr__);
    QDBusArgument::~QDBusArgument(&local_30);
  }
  else {
    local_28.d_ptr = &QtPrivate::QMetaTypeInterfaceWrapper<QDBusObjectPath>::metaType;
    local_30.d = (QDBusArgumentPrivate *)(*(ulong *)&(v->d).field_0x18 & 0xfffffffffffffffc);
    bVar2 = comparesEqual((QMetaType *)&local_30,&local_28);
    if (bVar2) {
      if (((v->d).field_0x18 & 1) != 0) {
        pPVar1 = (v->d).data.shared;
        v = (QVariant *)(pPVar1 + *(int *)(pPVar1 + 4));
      }
      pPVar1 = (((Private *)&((PrivateShared *)v)->field_0x0)->data).shared;
      (__return_storage_ptr__->m_path).d.d = (Data *)pPVar1;
      (__return_storage_ptr__->m_path).d.ptr =
           *(char16_t **)&((PrivateShared *)((long)v + 8))->field_0x0;
      (__return_storage_ptr__->m_path).d.size =
           *(qsizetype *)&((PrivateShared *)((long)v + 0x10))->field_0x0;
      if (pPVar1 != (PrivateShared *)0x0) {
        LOCK();
        *(int *)pPVar1 = *(int *)pPVar1 + 1;
        UNLOCK();
      }
    }
    else {
      (__return_storage_ptr__->m_path).d.d = (Data *)0x0;
      (__return_storage_ptr__->m_path).d.ptr = (char16_t *)0x0;
      (__return_storage_ptr__->m_path).d.size = 0;
      QVar3.d_ptr = (QMetaTypeInterface *)QVariant::metaType();
      if (((v->d).field_0x18 & 1) != 0) {
        pPVar1 = (v->d).data.shared;
        v = (QVariant *)(pPVar1 + *(int *)(pPVar1 + 4));
      }
      QMetaType::convert(QVar3,v,local_28,__return_storage_ptr__);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

inline T qdbus_cast(const QVariant &v)
{
    if (v.metaType() == QMetaType::fromType<QDBusArgument>())
        return qdbus_cast<T>(qvariant_cast<QDBusArgument>(v));
    else
        return qvariant_cast<T>(v);
}